

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

int omac_acpkm_imit_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  long *plVar1;
  CMAC_ACPKM_CTX *out;
  CMAC_ACPKM_CTX *pCVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  OMAC_ACPKM_CTX *c_from;
  OMAC_ACPKM_CTX *c_to;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  plVar1 = (long *)EVP_MD_CTX_get0_md_data(in_RDI);
  out = (CMAC_ACPKM_CTX *)EVP_MD_CTX_get0_md_data(in_RSI);
  if ((out == (CMAC_ACPKM_CTX *)0x0) || (plVar1 == (long *)0x0)) {
    local_4 = 0;
  }
  else {
    plVar1[1] = (long)out->actx;
    plVar1[2] = *(long *)out->km;
    *(undefined4 *)(plVar1 + 3) = *(undefined4 *)(out->km + 8);
    if (out->cctx == (EVP_CIPHER_CTX *)0x0) {
      if (*plVar1 != 0) {
        CMAC_ACPKM_CTX_free((CMAC_ACPKM_CTX *)0x11add2);
        *plVar1 = 0;
      }
      local_4 = 1;
    }
    else {
      if (((EVP_CIPHER_CTX *)*plVar1 == out->cctx) || (*plVar1 == 0)) {
        pCVar2 = CMAC_ACPKM_CTX_new();
        *plVar1 = (long)pCVar2;
      }
      if (*plVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = CMAC_ACPKM_CTX_copy(out,(CMAC_ACPKM_CTX *)
                                          CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0));
      }
    }
  }
  return local_4;
}

Assistant:

static int omac_acpkm_imit_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    OMAC_ACPKM_CTX *c_to = EVP_MD_CTX_md_data(to);
    const OMAC_ACPKM_CTX *c_from = EVP_MD_CTX_md_data(from);

    if (c_from && c_to) {
        c_to->dgst_size = c_from->dgst_size;
        c_to->cipher_name = c_from->cipher_name;
        c_to->key_set = c_from->key_set;
    } else {
        return 0;
    }
    if (!c_from->cmac_ctx) {
        if (c_to->cmac_ctx) {
            CMAC_ACPKM_CTX_free(c_to->cmac_ctx);
            c_to->cmac_ctx = NULL;
        }
        return 1;
    }
    if ((c_to->cmac_ctx == c_from->cmac_ctx) || (c_to->cmac_ctx == NULL))  {
        c_to->cmac_ctx = CMAC_ACPKM_CTX_new();
    }

    return (c_to->cmac_ctx) ? CMAC_ACPKM_CTX_copy(c_to->cmac_ctx, c_from->cmac_ctx) : 0;
}